

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O1

QSettingsIniSection * __thiscall
QMap<QString,_QSettingsIniSection>::operator[]
          (QMap<QString,_QSettingsIniSection> *this,QString *key)

{
  QMapData<std::map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>_>
  *pQVar1;
  iterator iVar2;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_QString,_QSettingsIniSection>_>,_bool> pVar3;
  QMap<QString,_QSettingsIniSection> copy;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QSettingsIniKey,_QVariant,_std::less<QSettingsIniKey>,_std::allocator<std::pair<const_QSettingsIniKey,_QVariant>_>_>_>_>
  QStack_58;
  pair<const_QString,_QSettingsIniSection> local_50;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>_>_>
  local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 == (QMapData<std::map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>_>
                  *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type_conflict *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value == (__atomic_base<int>)0x1)) {
    local_28.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>_>_*>
          )(QMapData<std::map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>_>
            *)0x0;
  }
  else {
    local_28.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>_>_*>
          )(this->d).d.ptr;
    if (local_28.d.ptr !=
        (QMapData<std::map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>_>
         *)0x0) {
      LOCK();
      (((QMapData<std::map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>_>
         *)local_28.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value =
           (Type)((int)(((QMapData<std::map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>_>
                          *)local_28.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value + 1);
      UNLOCK();
    }
  }
  detach(this);
  iVar2 = std::
          _Rb_tree<QString,_std::pair<const_QString,_QSettingsIniSection>,_std::_Select1st<std::pair<const_QString,_QSettingsIniSection>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>
          ::find(&(((this->d).d.ptr)->m)._M_t,key);
  pQVar1 = (this->d).d.ptr;
  if ((_Rb_tree_header *)iVar2._M_node == &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header) {
    local_50.first.d.d = (key->d).d;
    local_50.first.d.ptr = (key->d).ptr;
    local_50.first.d.size = (key->d).size;
    if (&(local_50.first.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_50.first.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_50.first.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_50.second.position = -1;
    local_50.second.keyMap.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::map<QSettingsIniKey,_QVariant,_std::less<QSettingsIniKey>,_std::allocator<std::pair<const_QSettingsIniKey,_QVariant>_>_>_>_>
          )(totally_ordered_wrapper<QMapData<std::map<QSettingsIniKey,_QVariant,_std::less<QSettingsIniKey>,_std::allocator<std::pair<const_QSettingsIniKey,_QVariant>_>_>_>_*>
            )0x0;
    QStack_58.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<QSettingsIniKey,_QVariant,_std::less<QSettingsIniKey>,_std::allocator<std::pair<const_QSettingsIniKey,_QVariant>_>_>_>_*>
          )(QMapData<std::map<QSettingsIniKey,_QVariant,_std::less<QSettingsIniKey>,_std::allocator<std::pair<const_QSettingsIniKey,_QVariant>_>_>_>
            *)0x0;
    pVar3 = std::
            _Rb_tree<QString,std::pair<QString_const,QSettingsIniSection>,std::_Select1st<std::pair<QString_const,QSettingsIniSection>>,std::less<QString>,std::allocator<std::pair<QString_const,QSettingsIniSection>>>
            ::_M_insert_unique<std::pair<QString_const,QSettingsIniSection>>
                      ((_Rb_tree<QString,std::pair<QString_const,QSettingsIniSection>,std::_Select1st<std::pair<QString_const,QSettingsIniSection>>,std::less<QString>,std::allocator<std::pair<QString_const,QSettingsIniSection>>>
                        *)&pQVar1->m,&local_50);
    iVar2._M_node = (_Base_ptr)pVar3.first._M_node;
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QSettingsIniKey,_QVariant,_std::less<QSettingsIniKey>,_std::allocator<std::pair<const_QSettingsIniKey,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&local_50.second.keyMap.d);
    if (&(local_50.first.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_50.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_50.first.d.d)->super_QArrayData,2,0x10);
      }
    }
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QSettingsIniKey,_QVariant,_std::less<QSettingsIniKey>,_std::allocator<std::pair<const_QSettingsIniKey,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&QStack_58);
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QSettingsIniSection,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSettingsIniSection>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QSettingsIniSection *)&iVar2._M_node[1]._M_right;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }